

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

void Jf_ManProfileClasses(Jf_Man_t *p)

{
  int iVar1;
  int iVar2;
  int *pCut;
  char *pcVar3;
  bool bVar4;
  uint local_12d0;
  uint local_12cc;
  int CostOther;
  int Other;
  int CostTotal;
  int Total;
  int iFunc;
  int i;
  int Costs [595];
  int Counts [595];
  Gia_Obj_t *pObj;
  Jf_Man_t *p_local;
  
  memset(Costs + 0x252,0,0x94c);
  memset(&iFunc,0,0x94c);
  Other = 0;
  CostOther = 0;
  local_12cc = 0;
  local_12d0 = 0;
  printf("DSD classes that appear in more than %.1f %% of mapped nodes:\n",
         (double)p->pPars->nVerbLimit * 0.1);
  Total = 0;
  while( true ) {
    bVar4 = false;
    if (Total < p->pGia->nObjs) {
      register0x00000000 = Gia_ManObj(p->pGia,Total);
      bVar4 = register0x00000000 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjIsAnd(stack0xffffffffffffffe8);
    if (((iVar1 != 0) && (iVar1 = Gia_ObjIsBuf(stack0xffffffffffffffe8), iVar1 == 0)) &&
       (iVar1 = Gia_ObjRefNumId(p->pGia,Total), iVar1 != 0)) {
      pCut = Jf_ObjCutBest(p,Total);
      iVar1 = Jf_CutFuncClass(pCut);
      if (0x252 < iVar1) {
        __assert_fail("iFunc < 595",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                      ,0x13d,"void Jf_ManProfileClasses(Jf_Man_t *)");
      }
      if (p->pPars->fGenCnf != 0) {
        iVar2 = Jf_CutCnfSizeF(p,iVar1);
        (&iFunc)[iVar1] = iVar2 + (&iFunc)[iVar1];
        iVar2 = Jf_CutCnfSizeF(p,iVar1);
        CostOther = iVar2 + CostOther;
      }
      Costs[(long)iVar1 + 0x252] = Costs[(long)iVar1 + 0x252] + 1;
      Other = Other + 1;
    }
    Total = Total + 1;
  }
  iVar1 = Abc_MaxInt(CostOther,1);
  iVar2 = Abc_MaxInt(Other,1);
  for (Total = 0; Total < 0x253; Total = Total + 1) {
    if ((Costs[(long)Total + 0x252] == 0) ||
       (((double)Costs[(long)Total + 0x252] * 100.0) / (double)iVar2 <
        (double)p->pPars->nVerbLimit * 0.1)) {
      local_12cc = Costs[(long)Total + 0x252] + local_12cc;
      local_12d0 = (&iFunc)[Total] + local_12d0;
    }
    else {
      printf("%5d  :  ",(ulong)(uint)Total);
      pcVar3 = Sdm_ManReadDsdStr(p->pDsd,Total);
      printf("%-20s   ",pcVar3);
      printf("%8d  ",(ulong)(uint)Costs[(long)Total + 0x252]);
      printf("%5.1f %%   ",((double)Costs[(long)Total + 0x252] * 100.0) / (double)iVar2);
      printf("%8d  ",(ulong)(uint)(&iFunc)[Total]);
      printf("%5.1f %%",((double)(&iFunc)[Total] * 100.0) / (double)iVar1);
      printf("\n");
    }
  }
  printf("Other  :  ");
  printf("%-20s   ","");
  printf("%8d  ",(ulong)local_12cc);
  printf("%5.1f %%   ",((double)(int)local_12cc * 100.0) / (double)iVar2);
  printf("%8d  ",(ulong)local_12d0);
  printf("%5.1f %%",((double)(int)local_12d0 * 100.0) / (double)iVar1);
  printf("\n");
  return;
}

Assistant:

void Jf_ManProfileClasses( Jf_Man_t * p )
{
    Gia_Obj_t * pObj; 
    int Counts[595] = {0}, Costs[595] = {0};
    int i, iFunc, Total = 0, CostTotal = 0, Other = 0, CostOther = 0;
    printf( "DSD classes that appear in more than %.1f %% of mapped nodes:\n", 0.1 * p->pPars->nVerbLimit );
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( !Gia_ObjIsBuf(pObj) && Gia_ObjRefNumId(p->pGia, i) )
        {
            iFunc = Jf_CutFuncClass( Jf_ObjCutBest(p, i) );
            assert( iFunc < 595 );
            if ( p->pPars->fGenCnf )
            {
                Costs[iFunc] += Jf_CutCnfSizeF(p, iFunc);
                CostTotal += Jf_CutCnfSizeF(p, iFunc);
            }
            Counts[iFunc]++;
            Total++;
        }
    CostTotal = Abc_MaxInt(CostTotal, 1);
    Total = Abc_MaxInt(Total, 1);
    for ( i = 0; i < 595; i++ )
        if ( Counts[i] && 100.0 * Counts[i] / Total >= 0.1 * p->pPars->nVerbLimit )
        {
            printf( "%5d  :  ", i );
            printf( "%-20s   ", Sdm_ManReadDsdStr(p->pDsd, i) );
            printf( "%8d  ",    Counts[i] );
            printf( "%5.1f %%   ", 100.0 * Counts[i] / Total );
            printf( "%8d  ",    Costs[i] );
            printf( "%5.1f %%", 100.0 * Costs[i] / CostTotal );
            printf( "\n" );
        }
        else
        {
            Other += Counts[i];
            CostOther += Costs[i];
        }
    printf( "Other  :  " );
    printf( "%-20s   ",   "" );
    printf( "%8d  ",    Other );
    printf( "%5.1f %%   ", 100.0 * Other / Total );
    printf( "%8d  ",    CostOther );
    printf( "%5.1f %%", 100.0 * CostOther / CostTotal );
    printf( "\n" );
}